

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name.cc
# Opt level: O0

bool __thiscall bssl::X509NameAttribute::ValueAsStringUnsafe(X509NameAttribute *this,string *out)

{
  CBS_ASN1_TAG CVar1;
  der *pdVar2;
  size_t extraout_RDX;
  Span<const_unsigned_char> b;
  Input in;
  Input in_00;
  bssl *local_40;
  uchar *local_38;
  string_view local_30;
  string *local_20;
  string *out_local;
  X509NameAttribute *this_local;
  
  CVar1 = this->value_tag;
  local_20 = out;
  out_local = (string *)this;
  if (((CVar1 == 0xc) || (CVar1 - 0x13 < 2)) || (CVar1 == 0x16)) {
    Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
              ((Span<unsigned_char_const> *)&local_40,&this->value);
    b.size_ = extraout_RDX;
    b.data_ = local_38;
    local_30 = BytesAsStringView(local_40,b);
    ::std::__cxx11::string::operator=((string *)local_20,&local_30);
    this_local._7_1_ = true;
  }
  else if (CVar1 == 0x1c) {
    pdVar2 = (der *)(this->value).data_.data_;
    in.data_.size_ = (size_t)out;
    in.data_.data_ = (uchar *)(this->value).data_.size_;
    this_local._7_1_ = bssl::der::ParseUniversalString(pdVar2,in,(string *)pdVar2);
  }
  else {
    if (CVar1 != 0x1e) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name.cc"
                    ,0x56,"bool bssl::X509NameAttribute::ValueAsStringUnsafe(std::string *) const");
    }
    pdVar2 = (der *)(this->value).data_.data_;
    in_00.data_.size_ = (size_t)out;
    in_00.data_.data_ = (uchar *)(this->value).data_.size_;
    this_local._7_1_ = bssl::der::ParseBmpString(pdVar2,in_00,(string *)pdVar2);
  }
  return this_local._7_1_;
}

Assistant:

bool X509NameAttribute::ValueAsStringUnsafe(std::string *out) const {
  switch (value_tag) {
    case CBS_ASN1_IA5STRING:
    case CBS_ASN1_PRINTABLESTRING:
    case CBS_ASN1_T61STRING:
    case CBS_ASN1_UTF8STRING:
      *out = BytesAsStringView(value);
      return true;
    case CBS_ASN1_UNIVERSALSTRING:
      return der::ParseUniversalString(value, out);
    case CBS_ASN1_BMPSTRING:
      return der::ParseBmpString(value, out);
    default:
      assert(0);  // NOTREACHED
      return false;
  }
}